

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

Gia_Man_t * Mf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  Vec_Mem_t *p_00;
  int iVar1;
  Mf_Man_t *p_01;
  char *pName;
  Cnf_Dat_t *pCVar2;
  Gia_Man_t *local_38;
  Gia_Man_t *pCls;
  Gia_Man_t *pNew;
  Mf_Man_t *p;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  if (pPars->fGenCnf != 0) {
    pPars->fCutMin = 1;
  }
  iVar1 = Gia_ManHasChoices(pGia);
  if (iVar1 != 0) {
    pPars->fCutMin = 1;
    pPars->fCoarsen = 0;
  }
  local_38 = pGia;
  if (pPars->fCoarsen != 0) {
    local_38 = Gia_ManDupMuxes(pGia,pPars->nCoarseLimit);
  }
  p_01 = Mf_ManAlloc(local_38,pPars);
  p_01->pGia0 = pGia;
  if ((pPars->fVerbose != 0) && (pPars->fCoarsen != 0)) {
    printf("Initial ");
    Gia_ManPrintMuxStats(pGia);
    printf("\n");
    printf("Derived ");
    Gia_ManPrintMuxStats(local_38);
    printf("\n");
  }
  Mf_ManPrintInit(p_01);
  Mf_ManComputeCuts(p_01);
  p_01->Iter = 1;
  while (p_01->Iter < p_01->pPars->nRounds) {
    Mf_ManComputeMapping(p_01);
    p_01->Iter = p_01->Iter + 1;
  }
  p_01->fUseEla = 1;
  while (p_01->Iter < p_01->pPars->nRounds + pPars->nRoundsEla) {
    Mf_ManComputeMapping(p_01);
    p_01->Iter = p_01->Iter + 1;
  }
  if ((pPars->fVeryVerbose != 0) && (pPars->fCutMin != 0)) {
    p_00 = p_01->vTtMem;
    pName = Gia_ManName(p_01->pGia);
    Vec_MemDumpTruthTables(p_00,pName,pPars->nLutSize);
  }
  if (pPars->fCutMin == 0) {
    if (pPars->fCoarsen == 0) {
      pCls = Mf_ManDeriveMapping(p_01);
    }
    else {
      pCls = Mf_ManDeriveMappingCoarse(p_01);
    }
  }
  else {
    pCls = Mf_ManDeriveMappingGia(p_01);
  }
  if (p_01->pPars->fGenCnf != 0) {
    pCVar2 = Mf_ManDeriveCnf(p_01,p_01->pPars->fCnfObjIds,p_01->pPars->fAddOrCla);
    pGia->pData = pCVar2;
  }
  Gia_ManMappingVerify(pCls);
  Mf_ManPrintQuit(p_01,pCls);
  Mf_ManFree(p_01);
  if (local_38 != pGia) {
    Gia_ManStop(local_38);
  }
  return pCls;
}

Assistant:

Gia_Man_t * Mf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Mf_Man_t * p;
    Gia_Man_t * pNew, * pCls;
    if ( pPars->fGenCnf )
        pPars->fCutMin = 1;
    if ( Gia_ManHasChoices(pGia) )
        pPars->fCutMin = 1, pPars->fCoarsen = 0; 
    pCls = pPars->fCoarsen ? Gia_ManDupMuxes(pGia, pPars->nCoarseLimit) : pGia;
    p = Mf_ManAlloc( pCls, pPars );
    p->pGia0 = pGia;
    if ( pPars->fVerbose && pPars->fCoarsen )
    {
        printf( "Initial " );  Gia_ManPrintMuxStats( pGia );  printf( "\n" );
        printf( "Derived " );  Gia_ManPrintMuxStats( pCls );  printf( "\n" );
    }
    Mf_ManPrintInit( p );
    Mf_ManComputeCuts( p );
    for ( p->Iter = 1; p->Iter < p->pPars->nRounds; p->Iter++ )
        Mf_ManComputeMapping( p );
    p->fUseEla = 1;
    for ( ; p->Iter < p->pPars->nRounds + pPars->nRoundsEla; p->Iter++ )
        Mf_ManComputeMapping( p );
    if ( pPars->fVeryVerbose && pPars->fCutMin )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), pPars->nLutSize );
    if ( pPars->fCutMin )
        pNew = Mf_ManDeriveMappingGia( p );
    else if ( pPars->fCoarsen )
        pNew = Mf_ManDeriveMappingCoarse( p );
    else
        pNew = Mf_ManDeriveMapping( p );
    if ( p->pPars->fGenCnf )
        pGia->pData = Mf_ManDeriveCnf( p, p->pPars->fCnfObjIds, p->pPars->fAddOrCla );
//    if ( p->pPars->fGenCnf )
//        Mf_ManProfileTruths( p );
    Gia_ManMappingVerify( pNew );
    Mf_ManPrintQuit( p, pNew );
    Mf_ManFree( p );
    if ( pCls != pGia )
        Gia_ManStop( pCls );
    return pNew;
}